

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Namespace *n)

{
  pointer ppVar1;
  Expression *pEVar2;
  int iVar3;
  pool_ref<soul::AST::Function> *extraout_RDX;
  VariableDeclaration *pVVar4;
  pointer ppVar5;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions;
  CompileMessage local_50;
  
  ASTVisitor::visit(&this->super_ASTVisitor,n);
  functions.e = extraout_RDX;
  functions.s = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  checkForDuplicateFunctions
            ((SanityCheckPass *)
             (n->functions).
             super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ._M_impl.super__Vector_impl_data._M_start,functions);
  ppVar5 = (n->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (n->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar5 == ppVar1) {
      return;
    }
    pVVar4 = ppVar5->object;
    if (pVVar4->isConstant != true) break;
    pEVar2 = (pVVar4->initialValue).object;
    if (pEVar2 != (Expression *)0x0) {
      iVar3 = (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
      if ((char)iVar3 == '\0') {
        pVVar4 = ppVar5->object;
        break;
      }
    }
    ppVar5 = ppVar5 + 1;
  }
  CompileMessageHelpers::createMessage<>
            (&local_50,syntax,error,"Only constant variables can be declared inside a namespace");
  AST::Context::throwError(&(pVVar4->super_Statement).super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::Namespace& n) override
        {
            super::visit (n);
            checkForDuplicateFunctions (n.functions);

            for (auto& v : n.constants)
                if (! v->isCompileTimeConstant())
                    v->context.throwError (Errors::nonConstInNamespace());
        }